

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O1

QuaternionT<float> __thiscall
Gs::Slerp<Gs::QuaternionT<float>,float>
          (Gs *this,QuaternionT<float> *from,QuaternionT<float> *to,float *t)

{
  size_t i;
  long lVar1;
  float fVar2;
  float result;
  float fVar3;
  QuaternionT<float> QVar4;
  float scale0;
  float local_28;
  float local_24;
  
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = fVar3 + (&from->x)[lVar1] * (&to->x)[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  fVar2 = -fVar3;
  local_28 = *(float *)(&DAT_0010c120 + (ulong)(fVar3 < fVar2) * 4);
  if (fVar2 <= fVar3) {
    fVar2 = fVar3;
  }
  if (1.0 - fVar2 <= 1.1920929e-07) {
    local_24 = 1.0 - *t;
    local_28 = local_28 * *t;
  }
  else {
    fVar3 = acosf(fVar2);
    fVar2 = sinf(fVar3);
    local_24 = sinf((1.0 - *t) * fVar3);
    local_24 = local_24 / fVar2;
    fVar3 = sinf(fVar3 * *t);
    local_28 = (fVar3 / fVar2) * local_28;
  }
  QVar4 = Mix<Gs::QuaternionT<float>,float>(from,to,&local_24,&local_28);
  return QVar4;
}

Assistant:

TVector Slerp(const TVector& from, const TVector& to, const TScalar& t)
{
    TScalar omega, cosom, sinom;
    TScalar scale0, scale1;

    /* Calculate cosine */
    cosom = Dot<TVector, TScalar>(from, to);

    /* Adjust signs (if necessary) */
    if (cosom < TScalar(0))
    {
        cosom = -cosom;
        scale1 = TScalar(-1);
    }
    else
        scale1 = TScalar(1);

    /* Calculate coefficients */
    if ((TScalar(1) - cosom) > std::numeric_limits<TScalar>::epsilon())
    {
        /* Standard case (slerp) */
        omega = std::acos(cosom);
        sinom = std::sin(omega);
        scale0 = std::sin((TScalar(1) - t) * omega) / sinom;
        scale1 *= std::sin(t * omega) / sinom;
    }
    else
    {
        /* 'from' and 'to' quaternions are very close, so we can do a linear interpolation */
        scale0 = TScalar(1) - t;
        scale1 *= t;
    }

    /* Calculate final values */
    return Mix(from, to, scale0, scale1);
}